

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void __thiscall tcmalloc::ThreadCache::~ThreadCache(ThreadCache *this)

{
  uint uVar1;
  size_t sVar2;
  uint local_14;
  uint32_t cl;
  ThreadCache *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = Static::num_size_classes();
    if (uVar1 <= local_14) break;
    sVar2 = FreeList::length(this->list_ + local_14);
    if (sVar2 != 0) {
      sVar2 = FreeList::length(this->list_ + local_14);
      ReleaseToCentralCache(this,this->list_ + local_14,local_14,(int)sVar2);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

ThreadCache::~ThreadCache() {
  // Put unused memory back into central cache
  for (uint32_t cl = 0; cl < Static::num_size_classes(); ++cl) {
    if (list_[cl].length() > 0) {
      ReleaseToCentralCache(&list_[cl], cl, list_[cl].length());
    }
  }
}